

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

LY_ERR moveto_axis_scnode_next_first
                 (lysc_node **iter,lyxp_node_type *iter_type,lys_module **iter_mod,
                 uint32_t *iter_mod_idx,lysc_node *scnode,lyxp_node_type node_type,lyxp_axis axis,
                 lyxp_set *set,uint32_t getnext_opts)

{
  lyxp_node_type lVar1;
  lys_module *plVar2;
  lysc_node *plVar3;
  lysc_module *module;
  lysc_node *last;
  
  if (*iter != (lysc_node *)0x0) {
    __assert_fail("!*iter",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c",
                  0x195d,
                  "LY_ERR moveto_axis_scnode_next_first(const struct lysc_node **, enum lyxp_node_type *, const struct lys_module **, uint32_t *, const struct lysc_node *, enum lyxp_node_type, enum lyxp_axis, struct lyxp_set *, uint32_t)"
                 );
  }
  if (*iter_type != LYXP_NODE_NONE) {
    __assert_fail("!*iter_type",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c",
                  0x195e,
                  "LY_ERR moveto_axis_scnode_next_first(const struct lysc_node **, enum lyxp_node_type *, const struct lys_module **, uint32_t *, const struct lysc_node *, enum lyxp_node_type, enum lyxp_axis, struct lyxp_set *, uint32_t)"
                 );
  }
  *iter_mod = (lys_module *)0x0;
  *iter_mod_idx = 0;
  switch(axis) {
  case LYXP_AXIS_ANCESTOR:
  case LYXP_AXIS_PARENT:
    if (node_type != LYXP_NODE_ELEM) goto switchD_001a3e51_default;
    if (scnode == (lysc_node *)0x0) {
      plVar3 = (lysc_node *)0x0;
    }
    else {
      plVar3 = scnode->parent;
    }
    plVar3 = lysc_data_node(plVar3);
    if (plVar3 == (lysc_node *)0x0) {
      lVar1 = set->root_type;
      *iter = (lysc_node *)0x0;
      *iter_type = lVar1;
      if (lVar1 == LYXP_NODE_NONE) {
        return LY_ENOTFOUND;
      }
      return LY_SUCCESS;
    }
    goto LAB_001a3f80;
  case LYXP_AXIS_ANCESTOR_OR_SELF:
  case LYXP_AXIS_DESCENDANT_OR_SELF:
  case LYXP_AXIS_SELF:
    plVar3 = scnode;
    if (2 < node_type - LYXP_NODE_ROOT) goto switchD_001a3e51_default;
    goto LAB_001a3f87;
  case LYXP_AXIS_ATTRIBUTE:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c",
                  0x19a6,
                  "LY_ERR moveto_axis_scnode_next_first(const struct lysc_node **, enum lyxp_node_type *, const struct lys_module **, uint32_t *, const struct lysc_node *, enum lyxp_node_type, enum lyxp_axis, struct lyxp_set *, uint32_t)"
                 );
  case LYXP_AXIS_CHILD:
  case LYXP_AXIS_DESCENDANT:
    if (node_type - LYXP_NODE_ROOT < 2) {
      do {
        plVar2 = ly_ctx_get_module_iter(set->ctx,iter_mod_idx);
        *iter_mod = plVar2;
        if (plVar2 == (lys_module *)0x0) goto switchD_001a3e51_default;
      } while ((plVar2->compiled == (lysc_module *)0x0) ||
              (plVar3 = lys_getnext((lysc_node *)0x0,(lysc_node *)0x0,plVar2->compiled,getnext_opts)
              , plVar3 == (lysc_node *)0x0));
      goto LAB_001a3f58;
    }
    if (node_type != LYXP_NODE_ELEM) goto switchD_001a3e51_default;
    last = (lysc_node *)0x0;
    module = (lysc_module *)0x0;
    plVar3 = scnode;
    break;
  case LYXP_AXIS_FOLLOWING:
  case LYXP_AXIS_FOLLOWING_SIBLING:
    if (node_type != LYXP_NODE_ELEM) goto switchD_001a3e51_default;
    if (scnode == (lysc_node *)0x0) {
      plVar3 = (lysc_node *)0x0;
    }
    else {
      plVar3 = scnode->parent;
    }
    plVar3 = lysc_data_node(plVar3);
    module = scnode->module->compiled;
    last = scnode;
    break;
  case LYXP_AXIS_PRECEDING:
  case LYXP_AXIS_PRECEDING_SIBLING:
    if (node_type != LYXP_NODE_ELEM) goto switchD_001a3e51_default;
    if (scnode == (lysc_node *)0x0) {
      plVar3 = (lysc_node *)0x0;
    }
    else {
      plVar3 = scnode->parent;
    }
    plVar3 = lysc_data_node(plVar3);
    plVar3 = lys_getnext((lysc_node *)0x0,plVar3,scnode->module->compiled,getnext_opts);
    if (plVar3 == (lysc_node *)0x0 || plVar3 == scnode) goto switchD_001a3e51_default;
LAB_001a3f58:
    node_type = LYXP_NODE_ELEM;
    goto LAB_001a3f87;
  default:
    goto switchD_001a3e51_default;
  }
  plVar3 = lys_getnext(last,plVar3,module,getnext_opts);
  if (plVar3 == (lysc_node *)0x0) {
switchD_001a3e51_default:
    *iter = (lysc_node *)0x0;
    *iter_type = LYXP_NODE_NONE;
    return LY_ENOTFOUND;
  }
LAB_001a3f80:
  node_type = LYXP_NODE_ELEM;
LAB_001a3f87:
  *iter = plVar3;
  *iter_type = node_type;
  return LY_SUCCESS;
}

Assistant:

static LY_ERR
moveto_axis_scnode_next_first(const struct lysc_node **iter, enum lyxp_node_type *iter_type, const struct lys_module **iter_mod,
        uint32_t *iter_mod_idx, const struct lysc_node *scnode, enum lyxp_node_type node_type, enum lyxp_axis axis,
        struct lyxp_set *set, uint32_t getnext_opts)
{
    const struct lysc_node *next = NULL;
    enum lyxp_node_type next_type = 0;

    assert(!*iter);
    assert(!*iter_type);

    *iter_mod = NULL;
    *iter_mod_idx = 0;

    switch (axis) {
    case LYXP_AXIS_ANCESTOR_OR_SELF:
    case LYXP_AXIS_DESCENDANT_OR_SELF:
    case LYXP_AXIS_SELF:
        if ((node_type == LYXP_NODE_ROOT_CONFIG) || (node_type == LYXP_NODE_ROOT) || (node_type == LYXP_NODE_ELEM)) {
            /* just return the node */
            next = scnode;
            next_type = node_type;
        }
        break;

    case LYXP_AXIS_ANCESTOR:
    case LYXP_AXIS_PARENT:
        if (node_type == LYXP_NODE_ELEM) {
            next = lysc_data_parent(scnode);
            next_type = next ? LYXP_NODE_ELEM : set->root_type;
        } /* else no parent */
        break;

    case LYXP_AXIS_DESCENDANT:
    case LYXP_AXIS_CHILD:
        if ((node_type == LYXP_NODE_ROOT_CONFIG) || (node_type == LYXP_NODE_ROOT)) {
            /* it can actually be in any module, it's all <running>, and even if it's moveto_mod (if set),
             * it can be in a top-level augment */
            while ((*iter_mod = ly_ctx_get_module_iter(set->ctx, iter_mod_idx))) {
                /* module may not be implemented or not compiled yet */
                if (!(*iter_mod)->compiled) {
                    continue;
                }

                /* get next node */
                if ((next = lys_getnext(NULL, NULL, (*iter_mod)->compiled, getnext_opts))) {
                    next_type = LYXP_NODE_ELEM;
                    break;
                }
            }
        } else if (node_type == LYXP_NODE_ELEM) {
            /* get next node */
            next = lys_getnext(NULL, scnode, NULL, getnext_opts);
            next_type = next ? LYXP_NODE_ELEM : 0;
        }
        break;

    case LYXP_AXIS_FOLLOWING:
    case LYXP_AXIS_FOLLOWING_SIBLING:
        if (node_type == LYXP_NODE_ELEM) {
            /* first next sibling */
            next = lys_getnext(scnode, lysc_data_parent(scnode), scnode->module->compiled, getnext_opts);
            next_type = next ? LYXP_NODE_ELEM : 0;
        } /* else no sibling */
        break;

    case LYXP_AXIS_PRECEDING:
    case LYXP_AXIS_PRECEDING_SIBLING:
        if (node_type == LYXP_NODE_ELEM) {
            /* first parent sibling */
            next = lys_getnext(NULL, lysc_data_parent(scnode), scnode->module->compiled, getnext_opts);
            if (next == scnode) {
                /* no preceding sibling */
                next = NULL;
            }
            next_type = next ? LYXP_NODE_ELEM : 0;
        } /* else no sibling */
        break;

    case LYXP_AXIS_ATTRIBUTE:
        /* unreachable */
        assert(0);
        LOGINT(set->ctx);
        break;
    }

    *iter = next;
    *iter_type = next_type;
    return next_type ? LY_SUCCESS : LY_ENOTFOUND;
}